

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateExtensionRegistrationCode
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *descriptor;
  Descriptor *pDVar1;
  int iVar2;
  ImmutableMessageLiteGenerator IStack_78;
  
  for (iVar2 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
      iVar2 < pDVar1->extension_count_; iVar2 = iVar2 + 1) {
    descriptor = Descriptor::extension(pDVar1,iVar2);
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
              ((ImmutableExtensionLiteGenerator *)&IStack_78,descriptor,this->context_);
    ImmutableExtensionLiteGenerator::GenerateRegistrationCode
              ((ImmutableExtensionLiteGenerator *)&IStack_78,printer);
    ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
              ((ImmutableExtensionLiteGenerator *)&IStack_78);
  }
  for (iVar2 = 0; iVar2 < pDVar1->nested_type_count_; iVar2 = iVar2 + 1) {
    pDVar1 = Descriptor::nested_type(pDVar1,iVar2);
    ImmutableMessageLiteGenerator(&IStack_78,pDVar1,this->context_);
    GenerateExtensionRegistrationCode(&IStack_78,printer);
    ~ImmutableMessageLiteGenerator(&IStack_78);
    pDVar1 = (this->super_MessageGenerator).descriptor_;
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateExtensionRegistrationCode(
    io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
        .GenerateExtensionRegistrationCode(printer);
  }
}